

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  cmValue cVar4;
  string *psVar5;
  ostream *poVar6;
  cmLocalGenerator *pcVar7;
  char *extraout_RDX;
  int iVar8;
  bool bVar9;
  string_view value;
  string EXCLUDE_FROM_ALL;
  cmGeneratorExpressionInterpreter genexInterpreter;
  int local_28c;
  string local_288;
  cmLocalGenerator *local_268;
  cmGeneratorTarget *local_260;
  string local_258;
  string local_238;
  string local_218;
  cmMakefile *local_1f8;
  pointer local_1f0;
  pointer local_1e8;
  string local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  ios_base local_138 [264];
  
  bVar3 = cmGeneratorTarget::IsInBuildSystem(target);
  bVar9 = true;
  if (bVar3) {
    pcVar1 = root->Makefile;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"EXCLUDE_FROM_ALL","");
    cVar4 = cmGeneratorTarget::GetProperty(target,&local_258);
    if (cVar4.Value == (string *)0x0) {
      pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
      bVar9 = IsExcluded((cmGlobalGenerator *)target,root,pcVar7);
    }
    else {
      local_260 = target;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_1c0,pcVar1,IncludeEmptyConfig);
      bVar9 = false;
      local_1f0 = local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_28c = 0;
        iVar8 = 0;
        local_268 = root;
        local_1f8 = pcVar1;
        do {
          pcVar2 = ((local_1c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          local_1e8 = local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e0,pcVar2,
                     pcVar2 + (local_1c0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_218._M_string_length = 0;
          local_218.field_2._M_local_buf[0] = '\0';
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                    ((cmGeneratorExpressionInterpreter *)local_1a8,local_268,&local_1e0,local_260,
                     &local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                     local_218.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
          psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                             ((cmGeneratorExpressionInterpreter *)local_1a8,&local_238,&local_258);
          value._M_str = extraout_RDX;
          value._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
          bVar3 = cmValue::IsOn((cmValue *)psVar5->_M_string_length,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_p != &local_150) {
            operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_p != &local_178) {
            operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
          }
          iVar8 = iVar8 + (uint)!bVar3;
          local_28c = local_28c + (uint)bVar3;
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)(local_1a8 + 0x10));
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1a8);
          pcVar7 = local_268;
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_1e8 + 1;
        } while (local_1c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != local_1f0);
        bVar9 = local_28c != 0;
        if ((bVar9) && (iVar8 != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The EXCLUDE_FROM_ALL property of target \"",0x29);
          pcVar1 = local_1f8;
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(local_260);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,
                              psVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\" varies by configuration. This is not supported by the \"",0x39);
          (*pcVar7->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_288);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_288._M_dataplus._M_p,local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" generator.",0xc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar9;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   const cmGeneratorTarget* target) const
{
  if (!target->IsInBuildSystem()) {
    return true;
  }
  cmMakefile* mf = root->GetMakefile();
  const std::string EXCLUDE_FROM_ALL = "EXCLUDE_FROM_ALL";
  if (cmValue exclude = target->GetProperty(EXCLUDE_FROM_ALL)) {
    // Expand the property value per configuration.
    unsigned int trueCount = 0;
    unsigned int falseCount = 0;
    const std::vector<std::string>& configs =
      mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (const std::string& config : configs) {
      cmGeneratorExpressionInterpreter genexInterpreter(root, config, target);
      if (cmIsOn(genexInterpreter.Evaluate(*exclude, EXCLUDE_FROM_ALL))) {
        ++trueCount;
      } else {
        ++falseCount;
      }
    }

    // Check whether the genex expansion of the property agrees in all
    // configurations.
    if (trueCount > 0 && falseCount > 0) {
      std::ostringstream e;
      e << "The EXCLUDE_FROM_ALL property of target \"" << target->GetName()
        << "\" varies by configuration. This is not supported by the \""
        << root->GetGlobalGenerator()->GetName() << "\" generator.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return trueCount;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}